

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O3

void __thiscall cs::statement_return::~statement_return(statement_return *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *in_RSI;
  
  tree_type<cs::token_base_*>::destroy((this->mTree).mRoot);
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_00251818;
  this_00 = (this->super_statement_base).context.
            super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  statement_base::operator_delete(&this->super_statement_base,in_RSI);
  return;
}

Assistant:

statement_return() = delete;